

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O1

void __thiscall
opengv::absolute_pose::modules::Epnp::qr_solve
          (Epnp *this,Matrix<double,_6,_4,_0,_6,_4> *A_orig,Matrix<double,_6,_1,_0,_6,_1> *b,
          Matrix<double,_4,_1,_0,_4,_1> *X)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined8 uVar13;
  double *pdVar14;
  long in_RAX;
  long lVar15;
  undefined1 *puVar16;
  long lVar17;
  double *pdVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  bool bVar25;
  double dVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  local_140 = vgatherdpd_avx512f(*(undefined4 *)
                                  ((long)(A_orig->
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_4,_0,_6,_4>_>
                                         ).m_storage.m_data.array + in_RAX));
  local_100 = vgatherdpd_avx512f(*(undefined4 *)
                                  ((long)(A_orig->
                                         super_PlainObjectBase<Eigen::Matrix<double,_6,_4,_0,_6,_4>_>
                                         ).m_storage.m_data.array + in_RAX));
  local_c0 = vgatherdpd_avx512f(*(undefined4 *)
                                 ((long)(A_orig->
                                        super_PlainObjectBase<Eigen::Matrix<double,_6,_4,_0,_6,_4>_>
                                        ).m_storage.m_data.array + in_RAX));
  if (qr_solve(Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
      ::max_nr == '\0') {
    qr_solve(Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&,Eigen::Matrix<double,int,int,int,int,int>&)
    ::max_nr = '\x01';
    qr_solve::A1 = (double *)operator_new__(0x30);
    qr_solve::A2 = (double *)operator_new__(0x30);
  }
  pdVar18 = (double *)local_140;
  uVar23 = 1;
  iVar19 = 0xa0;
  iVar24 = 0xc0;
  auVar40 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  auVar41 = ZEXT864(0) << 0x40;
  lVar17 = 0;
LAB_001800b2:
  pdVar14 = qr_solve::A1;
  if (lVar17 == 4) {
    puVar16 = local_140;
    lVar17 = 0x30;
    lVar20 = 0;
    auVar40 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pdVar18 = (double *)b;
    do {
      auVar30 = ZEXT816(0) << 0x40;
      lVar15 = 0;
      do {
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)(puVar16 + lVar15 * 4);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)((long)pdVar18 + lVar15);
        auVar30 = vfmadd231sd_fma(auVar30,auVar39,auVar11);
        lVar15 = lVar15 + 8;
      } while (lVar17 != lVar15);
      auVar38._8_8_ = auVar30._8_8_ ^ 0x8000000000000000;
      auVar38._0_8_ = -auVar30._0_8_ / pdVar14[lVar20];
      auVar41 = vpbroadcastq_avx512f();
      auVar27 = vbroadcastsd_avx512f(auVar38);
      uVar23 = vpcmpuq_avx512f(auVar41,auVar40,5);
      auVar41 = vgatherdpd_avx512f(*(undefined4 *)(puVar16 + lVar17));
      bVar5 = (byte)uVar23;
      auVar28._8_8_ = (ulong)((byte)(uVar23 >> 1) & 1) * auVar41._8_8_;
      auVar28._0_8_ = (ulong)(bVar5 & 1) * auVar41._0_8_;
      auVar28._16_8_ = (ulong)((byte)(uVar23 >> 2) & 1) * auVar41._16_8_;
      auVar28._24_8_ = (ulong)((byte)(uVar23 >> 3) & 1) * auVar41._24_8_;
      auVar28._32_8_ = (ulong)((byte)(uVar23 >> 4) & 1) * auVar41._32_8_;
      auVar28._40_8_ = (ulong)((byte)(uVar23 >> 5) & 1) * auVar41._40_8_;
      auVar28._48_8_ = (ulong)((byte)(uVar23 >> 6) & 1) * auVar41._48_8_;
      auVar28._56_8_ = (uVar23 >> 7) * auVar41._56_8_;
      pdVar1 = (b->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array + lVar20;
      auVar41._8_8_ = (ulong)((byte)(uVar23 >> 1) & 1) * (long)pdVar1[1];
      auVar41._0_8_ = (ulong)(bVar5 & 1) * (long)*pdVar1;
      auVar41._16_8_ = (ulong)((byte)(uVar23 >> 2) & 1) * (long)pdVar1[2];
      auVar41._24_8_ = (ulong)((byte)(uVar23 >> 3) & 1) * (long)pdVar1[3];
      auVar41._32_8_ = (ulong)((byte)(uVar23 >> 4) & 1) * (long)pdVar1[4];
      auVar41._40_8_ = (ulong)((byte)(uVar23 >> 5) & 1) * (long)pdVar1[5];
      auVar41._48_8_ = (ulong)((byte)(uVar23 >> 6) & 1) * (long)pdVar1[6];
      auVar41._56_8_ = (uVar23 >> 7) * (long)pdVar1[7];
      auVar41 = vfmadd231pd_avx512f(auVar41,auVar27,auVar28);
      pdVar1 = (b->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
               array + lVar20;
      bVar25 = (bool)((byte)(uVar23 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar23 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar23 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar23 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar23 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar23 >> 6) & 1);
      *pdVar1 = (double)((ulong)(bVar5 & 1) * auVar41._0_8_ |
                        (ulong)!(bool)(bVar5 & 1) * (long)*pdVar1);
      pdVar1[1] = (double)((ulong)bVar25 * auVar41._8_8_ | (ulong)!bVar25 * (long)pdVar1[1]);
      pdVar1[2] = (double)((ulong)bVar6 * auVar41._16_8_ | (ulong)!bVar6 * (long)pdVar1[2]);
      pdVar1[3] = (double)((ulong)bVar7 * auVar41._24_8_ | (ulong)!bVar7 * (long)pdVar1[3]);
      pdVar1[4] = (double)((ulong)bVar8 * auVar41._32_8_ | (ulong)!bVar8 * (long)pdVar1[4]);
      pdVar1[5] = (double)((ulong)bVar9 * auVar41._40_8_ | (ulong)!bVar9 * (long)pdVar1[5]);
      pdVar1[6] = (double)((ulong)bVar10 * auVar41._48_8_ | (ulong)!bVar10 * (long)pdVar1[6]);
      pdVar1[7] = (double)((uVar23 >> 7) * auVar41._56_8_ |
                          (ulong)!SUB81(uVar23 >> 7,0) * (long)pdVar1[7]);
      pdVar1 = qr_solve::A2;
      puVar16 = puVar16 + 0x28;
      lVar20 = lVar20 + 1;
      pdVar18 = pdVar18 + 1;
      lVar17 = lVar17 + -8;
    } while (lVar20 != 4);
    pdVar18 = (X->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
              array + 3;
    (X->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[3] =
         (b->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
         / qr_solve::A2[3];
    lVar20 = 2;
    lVar17 = 8;
    puVar16 = local_100 + 0x18;
    do {
      auVar30 = ZEXT816(0) << 0x40;
      lVar15 = 0;
      do {
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)(puVar16 + lVar15);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)((long)pdVar18 + lVar15);
        auVar30 = vfmadd231sd_fma(auVar30,auVar36,auVar4);
        lVar15 = lVar15 + 8;
      } while (lVar17 != lVar15);
      (X->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
      [lVar20] = ((b->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data
                  .array[lVar20] - auVar30._0_8_) / pdVar1[lVar20];
      pdVar18 = pdVar18 + -1;
      lVar17 = lVar17 + 8;
      puVar16 = puVar16 + -0x28;
      bVar25 = lVar20 != 0;
      lVar20 = lVar20 + -1;
    } while (bVar25);
  }
  else {
    lVar20 = lVar17 + 1;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *pdVar18;
    auVar30 = vandpd_avx(auVar30,auVar40._0_16_);
    lVar15 = 0;
    do {
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)((long)pdVar18 + lVar15);
      auVar11 = vandpd_avx(auVar31,auVar40._0_16_);
      auVar30 = vmaxsd_avx(auVar11,auVar30);
      dVar12 = auVar30._0_8_;
      lVar15 = lVar15 + 0x20;
    } while (iVar19 != (int)lVar15);
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      auVar30 = ZEXT816(0);
      lVar15 = 0;
      do {
        dVar29 = (1.0 / dVar12) * *(double *)((long)pdVar18 + lVar15);
        *(double *)((long)pdVar18 + lVar15) = dVar29;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = dVar29;
        auVar30 = vfmadd231sd_fma(auVar30,auVar37,auVar37);
        lVar15 = lVar15 + 0x20;
      } while (iVar24 != (int)lVar15);
      if (auVar30._0_8_ < 0.0) {
        dVar29 = sqrt(auVar30._0_8_);
        auVar41 = ZEXT864(0) << 0x40;
        auVar40 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      }
      else {
        auVar30 = vsqrtsd_avx(auVar30,auVar30);
        dVar29 = auVar30._0_8_;
      }
      pdVar14 = qr_solve::A1;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *pdVar18;
      uVar13 = vcmpsd_avx512f(auVar33,auVar41._0_16_,1);
      bVar25 = (bool)((byte)uVar13 & 1);
      dVar26 = (double)((ulong)bVar25 * (long)-dVar29 + (ulong)!bVar25 * (long)dVar29);
      dVar29 = *pdVar18 + dVar26;
      *pdVar18 = dVar29;
      qr_solve::A1[lVar17] = dVar26 * dVar29;
      qr_solve::A2[lVar17] = dVar26 * -dVar12;
      if (lVar17 != 3) {
        lVar15 = 8;
        uVar22 = uVar23;
        do {
          auVar30 = ZEXT816(0) << 0x40;
          lVar21 = 0;
          do {
            auVar34._8_8_ = 0;
            auVar34._0_8_ = *(ulong *)((long)pdVar18 + lVar21);
            auVar2._8_8_ = 0;
            auVar2._0_8_ = *(ulong *)((long)pdVar18 + lVar21 + lVar15);
            auVar30 = vfmadd231sd_fma(auVar30,auVar34,auVar2);
            lVar21 = lVar21 + 0x20;
          } while (iVar24 != (int)lVar21);
          auVar32._8_8_ = auVar30._8_8_ ^ 0x8000000000000000;
          auVar32._0_8_ = -auVar30._0_8_ / pdVar14[lVar17];
          lVar21 = 0;
          do {
            auVar35._8_8_ = 0;
            auVar35._0_8_ = *(ulong *)((long)pdVar18 + lVar21);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)((long)pdVar18 + lVar21 + lVar15);
            auVar30 = vfmadd213sd_fma(auVar35,auVar32,auVar3);
            *(long *)((long)pdVar18 + lVar21 + lVar15) = auVar30._0_8_;
            lVar21 = lVar21 + 0x20;
          } while (iVar24 != (int)lVar21);
          lVar15 = lVar15 + 8;
          bVar25 = uVar22 < 3;
          uVar22 = uVar22 + 1;
        } while (bVar25);
      }
      pdVar18 = pdVar18 + 5;
    }
    else {
      qr_solve::A2[lVar17] = 0.0;
      qr_solve::A1[lVar17] = 0.0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"God damnit, A is singular, this shouldn\'t happen.",0x31);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      auVar41 = ZEXT864(0) << 0x40;
      auVar40 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    }
    uVar23 = uVar23 + 1;
    iVar19 = iVar19 + -0x20;
    iVar24 = iVar24 + -0x20;
    lVar17 = lVar20;
    if ((dVar12 != 0.0) || (NAN(dVar12))) goto LAB_001800b2;
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::qr_solve(
    Eigen::Matrix<double,6,4> & A_orig,
    Eigen::Matrix<double,6,1> & b,
    Eigen::Matrix<double,4,1> & X)
{
  Eigen::Matrix<double,4,6> A = A_orig.transpose();

  static int max_nr = 0;
  static double * A1, * A2;

  const int nr = A_orig.rows();
  const int nc = A_orig.cols();

  if (max_nr != 0 && max_nr < nr)
  {
    delete [] A1;
    delete [] A2;
  }
  if (max_nr < nr)
  {
    max_nr = nr;
    A1 = new double[nr];
    A2 = new double[nr];
  }

  double * pA = A.data(), * ppAkk = pA;
  for(int k = 0; k < nc; k++)
  {
    double * ppAik = ppAkk, eta = fabs(*ppAik);
    for(int i = k + 1; i < nr; i++)
    {
      double elt = fabs(*ppAik);
      if (eta < elt) eta = elt;
      ppAik += nc;
    }

    if (eta == 0)
    {
      A1[k] = A2[k] = 0.0;
      cerr << "God damnit, A is singular, this shouldn't happen." << endl;
      return;
    }
    else
    {
      double * ppAik = ppAkk, sum = 0.0, inv_eta = 1. / eta;
      for(int i = k; i < nr; i++)
      {
        *ppAik *= inv_eta;
        sum += *ppAik * *ppAik;
        ppAik += nc;
      }
      double sigma = sqrt(sum);
      if (*ppAkk < 0)
        sigma = -sigma;
      *ppAkk += sigma;
      A1[k] = sigma * *ppAkk;
      A2[k] = -eta * sigma;
      for(int j = k + 1; j < nc; j++)
      {
        double * ppAik = ppAkk, sum = 0;
        for(int i = k; i < nr; i++)
        {
          sum += *ppAik * ppAik[j - k];
          ppAik += nc;
        }
        double tau = sum / A1[k];
        ppAik = ppAkk;
        for(int i = k; i < nr; i++)
        {
          ppAik[j - k] -= tau * *ppAik;
          ppAik += nc;
        }
      }
    }
    ppAkk += nc + 1;
  }

  // b <- Qt b
  double * ppAjj = pA, * pb = b.data();
  for(int j = 0; j < nc; j++)
  {
    double * ppAij = ppAjj, tau = 0;
    for(int i = j; i < nr; i++)
    {
      tau += *ppAij * pb[i];
      ppAij += nc;
    }
    tau /= A1[j];
    ppAij = ppAjj;
    for(int i = j; i < nr; i++)
    {
      pb[i] -= tau * *ppAij;
      ppAij += nc;
    }
    ppAjj += nc + 1;
  }

  // X = R-1 b
  double * pX = X.data();
  pX[nc - 1] = pb[nc - 1] / A2[nc - 1];
  for(int i = nc - 2; i >= 0; i--)
  {
    double * ppAij = pA + i * nc + (i + 1), sum = 0;

    for(int j = i + 1; j < nc; j++)
    {
      sum += *ppAij * pX[j];
      ppAij++;
    }
    pX[i] = (pb[i] - sum) / A2[i];
  }
}